

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O0

void sfts_delete_key(sfts_t *f,char *key)

{
  char *errtext;
  long in_RSI;
  long in_RDI;
  char *_base;
  char _msg [31];
  int *in_stack_00000158;
  char *in_stack_00000160;
  fitsfile *in_stack_00000168;
  undefined1 local_38 [30];
  undefined1 local_1a;
  long local_8;
  
  if (in_RSI == 0) {
    _p2sc_msg("sfts_delete_key",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
              ,0x1cb,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x12c0,"NULL keyword");
    exit(1);
  }
  local_8 = in_RDI;
  ffdkey(in_stack_00000168,in_stack_00000160,in_stack_00000158);
  if ((local_8 != 0) && (*(int *)(local_8 + 0x20) != 0)) {
    if (*(long *)(local_8 + 0x10) == 0) {
      errtext = (char *)g_strdup("memory");
    }
    else {
      errtext = (char *)g_path_get_basename(*(undefined8 *)(local_8 + 0x10));
    }
    ffgerr((int)((ulong)errtext >> 0x20),errtext);
    local_1a = 0;
    _p2sc_msg("sfts_delete_key",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
              ,0x1cf,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,"FITS: %s: %s",
              local_38,errtext);
    exit(1);
  }
  return;
}

Assistant:

void sfts_delete_key(sfts_t *f, const char *key) {
    if (!key) {
        P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "NULL keyword");
        return;
    }
    fits_delete_key(f->fts, key, &f->stat);
    CHK_FTS(f);
}